

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O0

bool __thiscall
soul::Type::isValidArrayOrVectorRange<unsigned_long>
          (Type *this,unsigned_long start,unsigned_long end)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  bool local_21;
  unsigned_long end_local;
  unsigned_long start_local;
  Type *this_local;
  
  bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,start);
  local_21 = false;
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<unsigned_long>(this,end);
    if ((!bVar1) && (AVar2 = getArrayOrVectorSize(this), end != AVar2)) {
      return false;
    }
    AVar2 = convertArrayOrVectorIndexToValidRange<unsigned_long>(this,start);
    AVar3 = convertArrayOrVectorIndexToValidRange<unsigned_long>(this,end);
    local_21 = false;
    if (AVar2 < AVar3) {
      local_21 = end != 0;
    }
  }
  return local_21;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }